

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall kratos::IfStmt::set_parent(IfStmt *this,IRNode *node)

{
  element_type *peVar1;
  element_type *peVar2;
  
  (this->super_Stmt).parent_ = node;
  peVar1 = (this->then_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar1,this);
  peVar1 = (this->else_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[7])(peVar1,this);
  peVar2 = (this->predicate_stmt_).
           super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_Stmt).super_IRNode._vptr_IRNode[7])(peVar2,this);
  return;
}

Assistant:

void IfStmt::set_parent(IRNode *node) {
    Stmt::set_parent(node);
    then_body_->set_parent(this);
    else_body_->set_parent(this);
    predicate_stmt_->set_parent(this);
}